

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int css(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean,
       double *var,double *resid,double *loglik,double *hess)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  double *oup;
  alik_css_object __ptr;
  double *xi;
  double *xf;
  double *col;
  double *dx;
  int *ipiv;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int N_00;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  undefined1 local_a0 [8];
  custom_function fcss_min;
  
  uVar5 = (ulong)(uint)N;
  oup = (double *)malloc((long)(N - d) << 3);
  if (d < 1) {
    dVar10 = mean(inp,N);
    *wmean = dVar10;
    uVar9 = 0;
    uVar3 = 0;
    if (0 < N) {
      uVar3 = (ulong)(uint)N;
    }
    for (; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      oup[uVar9] = inp[uVar9];
    }
  }
  else {
    uVar1 = diff(inp,N,d,oup);
    uVar5 = (ulong)uVar1;
    *wmean = 0.0;
  }
  N_00 = (int)uVar5;
  __ptr = alik_css_init(p,d,q,N_00);
  uVar1 = __ptr->pq;
  lVar8 = (long)(int)uVar1;
  __size = lVar8 * 8;
  xi = (double *)malloc(__size);
  xf = (double *)malloc(__size);
  col = (double *)malloc(__size * lVar8);
  dx = (double *)malloc(__size);
  ipiv = (int *)malloc(lVar8 << 2);
  __ptr->N = N_00;
  dVar10 = *wmean;
  __ptr->mean = dVar10;
  uVar3 = 0;
  uVar9 = 0;
  if (0 < p) {
    uVar9 = (ulong)(uint)p;
  }
  for (; uVar9 != uVar3; uVar3 = uVar3 + 1) {
    xi[uVar3] = 0.0;
  }
  fcss_min.params = (void *)(long)p;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < q) {
    uVar3 = (ulong)(uint)q;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    xi[(long)fcss_min.params + uVar4] = 0.0;
  }
  if (__ptr->M == 1) {
    xi[q + p] = dVar10;
  }
  uVar6 = 0;
  uVar4 = 0;
  if (0 < N_00) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    dVar10 = oup[uVar6];
    __ptr->x[(long)(N_00 * 2) + uVar6] = dVar10;
    __ptr->x[uVar6] = dVar10;
  }
  for (lVar8 = (long)N_00; lVar8 < N_00 * 2; lVar8 = lVar8 + 1) {
    __ptr->x[lVar8] = 0.0;
  }
  local_a0 = (undefined1  [8])fcss;
  fcss_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar2 = fminunc((custom_function *)local_a0,(custom_gradient *)0x0,uVar1,xi,1.0,optmethod,xf);
  if ((0xf < uVar2) || ((0x8011U >> (uVar2 & 0x1f) & 1) == 0)) {
    uVar2 = 1;
  }
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    dx[uVar5] = 1.0;
  }
  hessian_fd((custom_function *)local_a0,xf,uVar1,dx,__ptr->eps,hess);
  mtranspose(hess,uVar1,uVar1,col);
  uVar7 = N_00 - d;
  for (uVar5 = 0; uVar1 * uVar1 != uVar5; uVar5 = uVar5 + 1) {
    col[uVar5] = (hess[uVar5] + col[uVar5]) * (double)(int)uVar7 * 0.5;
  }
  ludecomp(col,uVar1,ipiv);
  minverse(col,uVar1,ipiv,hess);
  for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
    phi[uVar5] = xf[uVar5];
  }
  for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    theta[uVar5] = -xf[(long)fcss_min.params + uVar5];
  }
  dVar10 = 0.0;
  if (__ptr->M == 1) {
    dVar10 = xf[q + p];
  }
  *wmean = dVar10;
  *var = __ptr->ssq / (double)N_00;
  uVar9 = 0;
  uVar5 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar5 = uVar9;
  }
  for (; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    resid[uVar9] = __ptr->x[(long)N_00 + uVar9];
  }
  *loglik = __ptr->loglik;
  free(xi);
  free(xf);
  free(oup);
  free(col);
  free(dx);
  free(ipiv);
  free(__ptr);
  return uVar2;
}

Assistant:

int css(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean,double *var,double *resid,double *loglik,double *hess) {
	int i, pq, retval, length,M,ret;
	double *b, *tf, *x,*dx,*thess;
	int *ipiv;
	double maxstep;
	alik_css_object obj;

	x = (double*)malloc(sizeof(double)* (N - d));


	length = N;

	maxstep = 1.0;

	/*

	*/

	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
		M = 0;
		*wmean = 0.0;
	}
	else {
		*wmean = mean(inp, N);
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
		M = 1;
	}

	obj = alik_css_init(p, d, q, N);
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;
	obj->mean = *wmean;


	for (i = 0; i < p; ++i) {
		b[i] = 0.0;
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = 0.0;
	}

	if (obj->M == 1) {
		b[p + q] = obj->mean;
	}

	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2*N+i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function fcss_min = { fcss, obj };
	retval = fminunc(&fcss_min, NULL, pq, b, maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	} else if (retval == 15) {
		ret = 15;
	} else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	hessian_fd(&fcss_min, tf, pq, dx, obj->eps, hess);
	//mdisplay(hess, pq, pq);
	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	/*
	if (M == 1) {
		temp = 0.0;
		for (i = 0; i < p; ++i) {
			temp += phi[i];
		}
		*wmean = *wmean * (1.0 - temp);
	}
	else {
		*wmean = 0.0;
	}
	*/
	*var = (obj->ssq) / (double)N;
	for (i = 0; i < N - d; ++i) {
		resid[i] = obj->x[N+i];
	}
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	free_alik_css(obj);
	return ret;
}